

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O2

int openit(void)

{
  char *pcVar1;
  int num;
  
  num = 0;
  if ((u._1052_1_ & 1) == 0) {
    do_clear_area((int)u.ux,(int)u.uy,8,openone,&num);
    return num;
  }
  if (((u.ustuck)->data->mflags1 & 0x40000) == 0) goto LAB_00160833;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001607e9;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001607e4;
LAB_0016081d:
    pcVar1 = Monnam(u.ustuck);
    pline("%s opens its mouth!",pcVar1);
  }
  else {
LAB_001607e4:
    if (ublindf != (obj *)0x0) {
LAB_001607e9:
      if (ublindf->oartifact == '\x1d') goto LAB_0016081d;
    }
    pline("Its mouth opens!");
  }
LAB_00160833:
  expels(u.ustuck,(u.ustuck)->data,'\x01');
  return -1;
}

Assistant:

int openit(void)	/* returns number of things found and opened */
{
	int num = 0;

	if (u.uswallow) {
		if (is_animal(u.ustuck->data)) {
			if (Blind) pline("Its mouth opens!");
			else pline("%s opens its mouth!", Monnam(u.ustuck));
		}
		expels(u.ustuck, u.ustuck->data, TRUE);
		return -1;
	}

	do_clear_area(u.ux, u.uy, BOLT_LIM, openone, &num);
	return num;
}